

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_CCtx_loadDictionary_byReference(ZSTD_CCtx *cctx,void *dict,size_t dictSize)

{
  size_t sVar1;
  ZSTD_CCtx *in_stack_00000018;
  
  sVar1 = ZSTD_CCtx_loadDictionary_advanced
                    (in_stack_00000018,cctx,(size_t)dict,dictSize._4_4_,
                     (ZSTD_dictContentType_e)dictSize);
  return sVar1;
}

Assistant:

size_t ZSTD_CCtx_loadDictionary_byReference(
      ZSTD_CCtx* cctx, const void* dict, size_t dictSize)
{
    return ZSTD_CCtx_loadDictionary_advanced(
            cctx, dict, dictSize, ZSTD_dlm_byRef, ZSTD_dct_auto);
}